

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

FUDMFKey * __thiscall FUDMFKeys::Find(FUDMFKeys *this,FName *key)

{
  int iVar1;
  int iVar2;
  FUDMFKey *pFVar3;
  FUDMFKey *in_RAX;
  FUDMFKey *extraout_RAX;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  if (this->mSorted == false) {
    this->mSorted = true;
    qsort((this->super_TArray<FUDMFKey,_FUDMFKey>).Array,
          (ulong)(this->super_TArray<FUDMFKey,_FUDMFKey>).Count,0x20,udmfcmp);
    in_RAX = extraout_RAX;
  }
  iVar4 = (this->super_TArray<FUDMFKey,_FUDMFKey>).Count - 1;
  pFVar3 = (this->super_TArray<FUDMFKey,_FUDMFKey>).Array;
  iVar6 = 0;
  do {
    if (iVar4 < iVar6) {
      return (FUDMFKey *)0x0;
    }
    uVar5 = (uint)(iVar4 + iVar6) >> 1;
    iVar1 = pFVar3[uVar5].Key.Index;
    iVar2 = key->Index;
    if (iVar1 == iVar2) {
      in_RAX = pFVar3 + uVar5;
    }
    else if (iVar2 < iVar1) {
      iVar4 = uVar5 - 1;
    }
    else {
      iVar6 = uVar5 + 1;
    }
  } while (iVar1 != iVar2);
  return in_RAX;
}

Assistant:

FUDMFKey *FUDMFKeys::Find(FName key)
{
	if (!mSorted)
	{
		mSorted = true;
		Sort();
	}
	int min = 0, max = Size()-1;

	while (min <= max)
	{
		int mid = (min + max) / 2;
		if ((*this)[mid].Key == key)
		{
			return &(*this)[mid];
		}
		else if ((*this)[mid].Key <= key)
		{
			min = mid + 1;
		}
		else
		{
			max = mid - 1;
		}
	}
	return NULL;
}